

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O3

void __thiscall
blcl::net::server_interface<MsgType>::~server_interface(server_interface<MsgType> *this)

{
  _func_int ***ppp_Var1;
  service *psVar2;
  service_registry *psVar3;
  
  this->_vptr_server_interface = (_func_int **)&PTR__server_interface_0011f4d8;
  stop(this);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl(&(this->asio_acceptor_).impl_);
  if ((this->ctx_thread_)._M_id._M_thread != 0) {
    std::terminate();
  }
  psVar3 = (this->context_).super_execution_context.service_registry_;
  psVar2 = psVar3->first_service_;
  if (psVar2 != (service *)0x0) {
    do {
      (*psVar2->_vptr_service[2])(psVar2);
      psVar2 = psVar2->next_;
    } while (psVar2 != (service *)0x0);
    psVar3 = (this->context_).super_execution_context.service_registry_;
    psVar2 = psVar3->first_service_;
    if (psVar2 != (service *)0x0) {
      do {
        ppp_Var1 = &psVar2->_vptr_service;
        psVar2 = psVar2->next_;
        (*(*ppp_Var1)[1])();
        psVar3->first_service_ = psVar2;
      } while (psVar2 != (service *)0x0);
      psVar3 = (this->context_).super_execution_context.service_registry_;
      if (psVar3 == (service_registry *)0x0) {
        psVar3 = (service_registry *)0x0;
        goto LAB_00106e30;
      }
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)&psVar3->mutex_);
LAB_00106e30:
  operator_delete(psVar3,0x40);
  std::
  deque<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ::~deque(&this->connections_);
  tsqueue<blcl::net::owned_message<MsgType>_>::~tsqueue(&this->incoming_messages_);
  return;
}

Assistant:

virtual ~server_interface() {
            stop();
        }